

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O3

void phmap::priv::map_slot_policy<phmap::priv::NonStandardLayout,int>::
     transfer<phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
               (Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *alloc,
               slot_type *new_slot,slot_type *old_slot)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (new_slot->value).first._vptr_NonStandardLayout = (_func_int **)&PTR__NonStandardLayout_00323508;
  (new_slot->value).first.value._M_dataplus._M_p = (pointer)&(new_slot->value).first.value.field_2;
  pcVar1 = (old_slot->value).first.value._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(new_slot->value).first.value,pcVar1,
             pcVar1 + (old_slot->value).first.value._M_string_length);
  (new_slot->value).second = (old_slot->value).second;
  (old_slot->value).first._vptr_NonStandardLayout = (_func_int **)&PTR__NonStandardLayout_00323508;
  pcVar1 = (old_slot->value).first.value._M_dataplus._M_p;
  paVar2 = &(old_slot->value).first.value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
                         slot_type* old_slot) {
        emplace(new_slot);
        if (kMutableKeys::value) {
            phmap::allocator_traits<Allocator>::construct(
                *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
        } else {
            phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
                                                         std::move(old_slot->value));
        }
        destroy(alloc, old_slot);
    }